

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O3

SstStream SstReaderOpen(char *Name,SstParams Params,SMPI_Comm comm)

{
  pthread_mutex_t *__mutex;
  size_t __size;
  char *__ptr;
  CMConnection p_Var1;
  int iVar2;
  undefined4 uVar3;
  __pid_t _Var4;
  char *pcVar5;
  SstStream Stream;
  CP_Info p_Var6;
  attr_list p_Var7;
  char *pcVar8;
  CP_DP_Interface DPInfo;
  DP_RS_Stream pvVar9;
  void **__ptr_00;
  long lVar10;
  int *piVar11;
  _SstParams *p_Var12;
  size_t sVar13;
  CP_PeerConnection *pCVar14;
  undefined8 uVar15;
  uint uVar16;
  SMPI_Comm in_RCX;
  int *piVar17;
  FFSTypeHandle Type;
  timeval *root_info;
  int iVar18;
  SMPI_Comm comm_00;
  long lVar19;
  long lVar20;
  CMConnection rank0_to_rank0_conn;
  void *free_block;
  _ReaderActivateMsg Msg;
  timeval Stop;
  void *WriterFileID;
  char NeededDataPlane [32];
  _WriterResponseMsg *response;
  void *data_block;
  timeval Start;
  void *dpInfo;
  CMConnection local_f0;
  char *local_e8;
  char *******local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  void *local_c8;
  void *pvStack_c0;
  timeval local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *local_88;
  char *******local_80;
  char local_78 [32];
  long local_58;
  void *local_50;
  timeval local_48;
  void *local_38;
  
  pcVar5 = strdup(Name);
  local_f0 = (CMConnection)0x0;
  local_78[0x10] = '\0';
  local_78[0x11] = '\0';
  local_78[0x12] = '\0';
  local_78[0x13] = '\0';
  local_78[0x14] = '\0';
  local_78[0x15] = '\0';
  local_78[0x16] = '\0';
  local_78[0x17] = '\0';
  local_78[0x18] = '\0';
  local_78[0x19] = '\0';
  local_78[0x1a] = '\0';
  local_78[0x1b] = '\0';
  local_78[0x1c] = '\0';
  local_78[0x1d] = '\0';
  local_78[0x1e] = '\0';
  local_78[0x1f] = '\0';
  local_78[0] = '\0';
  local_78[1] = '\0';
  local_78[2] = '\0';
  local_78[3] = '\0';
  local_78[4] = '\0';
  local_78[5] = '\0';
  local_78[6] = '\0';
  local_78[7] = '\0';
  local_78[8] = '\0';
  local_78[9] = '\0';
  local_78[10] = '\0';
  local_78[0xb] = '\0';
  local_78[0xc] = '\0';
  local_78[0xd] = '\0';
  local_78[0xe] = '\0';
  local_78[0xf] = '\0';
  Stream = CP_newStream();
  Stream->Role = ReaderRole;
  Stream->mpiComm = comm;
  piVar17 = &Stream->Rank;
  SMPI_Comm_rank(comm,piVar17);
  SMPI_Comm_size(Stream->mpiComm,&Stream->CohortSize);
  CP_validateParams(Stream,Params,0);
  Stream->ConfigParams = Params;
  p_Var6 = CP_getCPInfo(Params->ControlModule);
  Stream->CPInfo = p_Var6;
  Stream->FinalTimestep = 0x7fffffffffffffff;
  Stream->LastDPNotifiedTimestep = -1;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  p_Var7 = ContactWriter(Stream,pcVar5,Params,in_RCX,&local_f0,&local_80);
  p_Var1 = local_f0;
  if (p_Var7 == (attr_list)0x0) {
    SstStreamDestroy(Stream);
    free(Stream);
    local_e8 = pcVar5;
    goto LAB_0072b822;
  }
  if (*piVar17 == 0) {
    local_b8.tv_usec = 0;
    local_b8.tv_sec = (__time_t)local_80;
    uVar3 = CMCondition_get(Stream->CPInfo->SharedCM->cm,local_f0);
    local_b8.tv_usec = CONCAT44(local_b8.tv_usec._4_4_,uVar3);
    CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,uVar3,local_78);
    iVar2 = CMwrite(p_Var1,Stream->CPInfo->SharedCM->DPQueryFormat,&local_b8);
    if (iVar2 != 1) {
      CP_verbose(Stream,CriticalVerbose,
                 "DPQuery message failed to send to writer in SstReaderOpen\n");
    }
    CP_verbose(Stream,PerRankVerbose,
               "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n",pcVar5,
               local_b8.tv_usec & 0xffffffff);
    iVar2 = CMCondition_wait(Stream->CPInfo->SharedCM->cm,local_b8.tv_usec & 0xffffffff);
    if (iVar2 == 0) {
      SstReaderOpen_cold_1();
      return (SstStream)0x0;
    }
    CP_verbose(Stream,PerRankVerbose,
               "finished wait writer DPresponse message in read_open, WRITER is using \"%s\" DataPlane\n"
              );
    comm_00 = Stream->mpiComm;
  }
  else {
    comm_00 = Stream->mpiComm;
  }
  SMPI_Bcast(local_78,0x20,SMPI_CHAR,0,comm_00);
  p_Var12 = Stream->ConfigParams;
  __ptr = p_Var12->DataTransport;
  pcVar8 = strdup(local_78);
  p_Var12->DataTransport = pcVar8;
  DPInfo = SelectDP(&Svcs,Stream,p_Var12,Stream->Rank);
  Stream->DP_Interface = DPInfo;
  if ((DPInfo != (CP_DP_Interface)0x0) && (iVar2 = strcmp(DPInfo->DPName,local_78), iVar2 != 0)) {
    fprintf(_stderr,
            "The writer is using the %s DataPlane for SST data transport, but the reader has failed to load this transport.  Communication cannot occur.  See the SST DataTransport engine parameter to force a match."
            ,local_78);
    return (SstStream)0x0;
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
    DPInfo = Stream->DP_Interface;
  }
  FinalizeCPInfo(Stream->CPInfo,DPInfo);
  pvVar9 = (*Stream->DP_Interface->initReader)
                     (&Svcs,Stream,&local_38,Stream->ConfigParams,p_Var7,&Stream->Stats);
  Stream->DP_Stream = pvVar9;
  free_attr_list(p_Var7);
  local_e0 = (char *******)CP_GetContactString(Stream,(attr_list)0x0);
  local_b8.tv_sec = (__time_t)&local_e0;
  local_b8.tv_usec = (__suseconds_t)local_38;
  local_d8 = Stream;
  __ptr_00 = CP_consolidateDataToRankZero
                       (Stream,&local_b8,Stream->CPInfo->PerRankReaderInfoFormat,&local_50);
  free(local_e0);
  p_Var1 = local_f0;
  local_88 = pcVar5;
  if (Stream->Rank == 0) {
    local_c8 = (void *)0x0;
    pvStack_c0 = (void *)0x0;
    local_d8 = (SstStream)0x0;
    uStack_d0 = 0;
    local_b8.tv_usec = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    local_b8.tv_sec = 0xffffffff;
    local_e0 = local_80;
    uVar3 = CMCondition_get(Stream->CPInfo->SharedCM->cm,local_f0);
    iVar2 = Stream->CohortSize;
    local_d8 = (SstStream)CONCAT44(iVar2,uVar3);
    uVar16 = Stream->ConfigParams->SpeculativePreloadMode;
    if (uVar16 < 2) {
LAB_0072b5fa:
      uStack_d0 = CONCAT44(uStack_d0._4_4_,uVar16);
    }
    else if (uVar16 == 2) {
      uVar16 = (uint)(iVar2 <= Stream->ConfigParams->SpecAutoNodeThreshold);
      goto LAB_0072b5fa;
    }
    __size = (long)iVar2 * 8;
    local_c8 = malloc(__size);
    pvStack_c0 = malloc(__size);
    if (0 < iVar2) {
      lVar10 = 0;
      do {
        *(undefined8 *)((long)local_c8 + lVar10 * 8) = *__ptr_00[lVar10];
        *(undefined8 *)((long)pvStack_c0 + lVar10 * 8) = *(undefined8 *)((long)__ptr_00[lVar10] + 8)
        ;
        lVar10 = lVar10 + 1;
      } while (iVar2 != lVar10);
    }
    free(__ptr_00);
    local_58 = 0;
    CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,(ulong)local_d8 & 0xffffffff);
    iVar2 = CMwrite(p_Var1,Stream->CPInfo->SharedCM->ReaderRegisterFormat,&local_e0);
    if (iVar2 != 1) {
      CP_verbose(Stream,CriticalVerbose,"Message failed to send to writer in SstReaderOpen\n");
    }
    free(local_c8);
    free(pvStack_c0);
    CP_verbose(Stream,PerRankVerbose,"Waiting for writer response message in SstReadOpen(\"%s\")\n",
               local_88);
    iVar2 = CMCondition_wait(Stream->CPInfo->SharedCM->cm,(ulong)local_d8 & 0xffffffff);
    if (iVar2 == 0) {
      fwrite("The writer exited before the SST Reader Open could be completed.\n",0x41,1,_stderr);
      return (SstStream)0x0;
    }
    CP_verbose(Stream,PerRankVerbose,"finished wait writer response message in read_open\n");
    if (local_58 != 0) {
      local_b8.tv_sec = CONCAT44(local_b8.tv_sec._4_4_,*(undefined4 *)(local_58 + 4));
      local_b8.tv_usec = *(ulong *)(local_58 + 8);
      local_a8 = *(undefined8 *)(local_58 + 0x10);
      uStack_a0 = *(undefined8 *)(local_58 + 0x18);
      local_98 = *(undefined8 *)(local_58 + 0x20);
    }
    Type = Stream->CPInfo->CombinedWriterInfoFormat;
    root_info = &local_b8;
  }
  else {
    Type = Stream->CPInfo->CombinedWriterInfoFormat;
    root_info = (timeval *)0x0;
  }
  piVar11 = (int *)CP_distributeDataFromRankZero(Stream,root_info,Type,&local_e8);
  free(local_50);
  iVar2 = *piVar11;
  if (iVar2 == -1) {
LAB_0072b822:
    free(local_e8);
    return (SstStream)0x0;
  }
  if (*piVar17 == 0) {
    CP_verbose(Stream,SummaryVerbose,"Opening Reader Stream.\nWriter stream params are:\n");
    CP_dumpParams(Stream,*(_SstParams **)(piVar11 + 2),0);
    CP_verbose(Stream,SummaryVerbose,"Reader stream params are:\n");
    CP_dumpParams(Stream,Stream->ConfigParams,1);
    iVar2 = *piVar11;
  }
  Stream->WriterCohortSize = iVar2;
  p_Var12 = *(_SstParams **)(piVar11 + 2);
  Stream->WriterConfigParams = p_Var12;
  sVar13 = p_Var12->MarshalMethod;
  if (sVar13 == 0) {
    if (*piVar17 == 0) {
      CP_verbose(Stream,SummaryVerbose,"Writer is doing FFS-based marshalling\n");
      p_Var12 = Stream->WriterConfigParams;
      sVar13 = p_Var12->MarshalMethod;
      goto LAB_0072b7f2;
    }
  }
  else {
LAB_0072b7f2:
    if ((sVar13 == 1) && (*piVar17 == 0)) {
      CP_verbose(Stream,SummaryVerbose,"Writer is doing BP-based marshalling\n");
      p_Var12 = Stream->WriterConfigParams;
    }
  }
  sVar13 = p_Var12->CPCommPattern;
  if (sVar13 == 0) {
    if (*piVar17 == 0) {
      CP_verbose(Stream,SummaryVerbose,
                 "Writer is using Minimum Connection Communication pattern (min)\n");
      sVar13 = Stream->WriterConfigParams->CPCommPattern;
      goto LAB_0072b841;
    }
  }
  else {
LAB_0072b841:
    if ((sVar13 == 1) && (*piVar17 == 0)) {
      CP_verbose(Stream,SummaryVerbose,"Writer is using Peer-based Communication pattern (peer)\n");
    }
  }
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  Stream->ReaderTimestep = *(long *)(piVar11 + 4) + -1;
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    getPeerArrays(Stream->CohortSize,Stream->Rank,Stream->WriterCohortSize,&Stream->Peers,
                  (int **)0x0);
    do {
      if (Stream->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
        _Var4 = getpid();
        pthread_self();
        CP_verbose(Stream,PerRankVerbose,"(PID %lx, TID %lx) Waiting for first Peer notification\n",
                   (long)_Var4);
      }
      else {
        piVar17 = Stream->Peers;
        iVar2 = *piVar17;
        if (iVar2 == -1) goto LAB_0072b988;
        iVar18 = 0;
        do {
          piVar17 = piVar17 + 1;
          iVar18 = iVar18 + (uint)(Stream->ConnectionsToWriter[iVar2].CMconn == (CMConnection)0x0);
          iVar2 = *piVar17;
        } while (iVar2 != -1);
        if (iVar18 == 0) goto LAB_0072b988;
        CP_verbose(Stream,PerRankVerbose,"Rank %d waiting for %d forward peer connections\n",
                   (ulong)(uint)Stream->Rank);
      }
      pthread_cond_wait((pthread_cond_t *)&Stream->DataCondition,(pthread_mutex_t *)__mutex);
    } while( true );
  }
  iVar2 = *piVar11;
  if (Stream->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
    pCVar14 = (CP_PeerConnection *)calloc(0x18,(long)iVar2);
    Stream->ConnectionsToWriter = pCVar14;
  }
LAB_0072b9a8:
  if (0 < iVar2) {
    lVar10 = *(long *)(piVar11 + 6);
    lVar20 = 1;
    lVar19 = 0;
    do {
      uVar15 = attr_list_from_string(**(undefined8 **)(lVar10 + lVar19 * 8));
      pCVar14 = Stream->ConnectionsToWriter;
      *(undefined8 *)((long)pCVar14 + lVar20 * 8 + -8) = uVar15;
      lVar10 = *(long *)(piVar11 + 6);
      (&pCVar14->ContactList)[lVar20] = *(attr_list *)(*(long *)(lVar10 + lVar19 * 8) + 8);
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 3;
    } while (lVar19 < *piVar11);
  }
  pcVar5 = local_88;
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    if (local_f0 != (CMConnection)0x0) {
      CMConnection_dereference();
    }
  }
  else if (local_f0 != (CMConnection)0x0) {
    Stream->ConnectionsToWriter->CMconn = local_f0;
    CMconn_register_close_handler(local_f0,ReaderConnCloseHandler,Stream);
  }
  Stream->Status = Established;
  gettimeofday(&local_b8,(__timezone_ptr_t)0x0);
  lVar19 = local_b8.tv_usec - local_48.tv_usec;
  lVar10 = lVar19 + 1000000;
  if (-1 < lVar19) {
    lVar10 = lVar19;
  }
  Stream->OpenTimeSecs =
       (double)(long)(local_b8.tv_sec + ((lVar19 >> 0x3f) - local_48.tv_sec)) +
       (double)lVar10 / 1000000.0;
  gettimeofday((timeval *)&Stream->ValidStartTime,(__timezone_ptr_t)0x0);
  Stream->Filename = pcVar5;
  Stream->ParamsBlock = local_e8;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  AddToLastCallFreeList(Stream);
  (*Stream->DP_Interface->provideWriterDataToReader)
            (&Svcs,Stream->DP_Stream,*piVar11,Stream->ConnectionsToWriter,*(void ***)(piVar11 + 8));
  CP_verbose(Stream,PerRankVerbose,"Sending Reader Activate messages to writer\n");
  local_e0 = (char *******)0x0;
  sendOneToEachWriterRank(Stream,Stream->CPInfo->SharedCM->ReaderActivateFormat,&local_e0,&local_e0)
  ;
  CP_verbose(Stream,PerStepVerbose,"Finish opening Stream \"%s\", starting with Step number %ld\n",
             pcVar5,*(undefined8 *)(piVar11 + 4));
  return Stream;
LAB_0072b988:
  CP_verbose(Stream,PerRankVerbose,"Rank %d has all forward peer connections\n",
             (ulong)(uint)Stream->Rank);
  iVar2 = *piVar11;
  goto LAB_0072b9a8;
}

Assistant:

SstStream SstReaderOpen(const char *Name, SstParams Params, SMPI_Comm comm)
{
    SstStream Stream;
    void *dpInfo;
    struct _CP_DP_PairInfo **pointers;
    void *data_block;
    void *free_block;
    writer_data_t ReturnData;
    struct _ReaderActivateMsg Msg;
    struct timeval Start, Stop, Diff;
    char *Filename = strdup(Name);
    CMConnection rank0_to_rank0_conn = NULL;
    void *WriterFileID;
    char NeededDataPlane[32] = {0}; // Don't name a data plane longer than 31 chars

    Stream = CP_newStream();
    Stream->Role = ReaderRole;
    Stream->mpiComm = comm;

    SMPI_Comm_rank(Stream->mpiComm, &Stream->Rank);
    SMPI_Comm_size(Stream->mpiComm, &Stream->CohortSize);

    CP_validateParams(Stream, Params, 0 /* reader */);
    Stream->ConfigParams = Params;

    Stream->CPInfo = CP_getCPInfo(Stream->ConfigParams->ControlModule);

    Stream->FinalTimestep = SSIZE_T_MAX; /* set this on close */
    Stream->LastDPNotifiedTimestep = -1;

    gettimeofday(&Start, NULL);

    attr_list WriterContactAttributes =
        ContactWriter(Stream, Filename, Params, comm, &rank0_to_rank0_conn, &WriterFileID);

    if (WriterContactAttributes == NULL)
    {
        SstStreamDestroy(Stream);
        free(Stream);
        free(Filename);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        struct _DPQueryMsg DPQuery;
        memset(&DPQuery, 0, sizeof(DPQuery));

        DPQuery.WriterFile = WriterFileID;
        DPQuery.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);

        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition,
                                    &NeededDataPlane[0]);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->DPQueryFormat, &DPQuery) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "DPQuery message failed to send to writer in SstReaderOpen\n");
        }

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n", Filename,
                   DPQuery.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before contact could be made, "
                            "SST Open failed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose,
                   "finished wait writer DPresponse message in read_open, "
                   "WRITER is using \"%s\" DataPlane\n",
                   &NeededDataPlane[0]);

        // NeededDP should now contain the name of the dataplane the writer is
        // using
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    else
    {
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    {
        char *RequestedDP = Stream->ConfigParams->DataTransport;
        Stream->ConfigParams->DataTransport = strdup(&NeededDataPlane[0]);
        Stream->DP_Interface = SelectDP(&Svcs, Stream, Stream->ConfigParams, Stream->Rank);
        if (Stream->DP_Interface)
            if (strcmp(Stream->DP_Interface->DPName, &NeededDataPlane[0]) != 0)
            {
                fprintf(stderr,
                        "The writer is using the %s DataPlane for SST data "
                        "transport, but the reader has failed to load this "
                        "transport.  Communication cannot occur.  See the SST "
                        "DataTransport engine parameter to force a match.",
                        NeededDataPlane);
                return NULL;
            }
        if (RequestedDP)
            free(RequestedDP);
    }

    FinalizeCPInfo(Stream->CPInfo, Stream->DP_Interface);

    Stream->DP_Stream = Stream->DP_Interface->initReader(
        &Svcs, Stream, &dpInfo, Stream->ConfigParams, WriterContactAttributes, &Stream->Stats);

    free_attr_list(WriterContactAttributes);

    pointers =
        (struct _CP_DP_PairInfo **)ParticipateInReaderInitDataExchange(Stream, dpInfo, &data_block);

    if (Stream->Rank == 0)
    {
        struct _CombinedWriterInfo WriterData;
        struct _ReaderRegisterMsg ReaderRegister;

        memset(&ReaderRegister, 0, sizeof(ReaderRegister));
        memset(&WriterData, 0, sizeof(WriterData));
        WriterData.WriterCohortSize = -1;
        ReaderRegister.WriterFile = WriterFileID;
        ReaderRegister.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);
        ReaderRegister.ReaderCohortSize = Stream->CohortSize;
        switch (Stream->ConfigParams->SpeculativePreloadMode)
        {
        case SpecPreloadOff:
        case SpecPreloadOn:
            ReaderRegister.SpecPreload =
                (SpeculativePreloadMode)Stream->ConfigParams->SpeculativePreloadMode;
            break;
        case SpecPreloadAuto:
            ReaderRegister.SpecPreload = SpecPreloadOff;
            if (Stream->CohortSize <= Stream->ConfigParams->SpecAutoNodeThreshold)
            {
                ReaderRegister.SpecPreload = SpecPreloadOn;
            }
            break;
        }

        ReaderRegister.CP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        ReaderRegister.DP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        for (int i = 0; i < ReaderRegister.ReaderCohortSize; i++)
        {
            ReaderRegister.CP_ReaderInfo[i] = (CP_ReaderInitInfo)pointers[i]->CP_Info;
            ReaderRegister.DP_ReaderInfo[i] = pointers[i]->DP_Info;
        }
        free(pointers);

        /* the response value is set in the handler */
        volatile struct _WriterResponseMsg *response = NULL;
        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,
                                    ReaderRegister.WriterResponseCondition, (void *)&response);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->ReaderRegisterFormat,
                    &ReaderRegister) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to writer in SstReaderOpen\n");
        }
        free(ReaderRegister.CP_ReaderInfo);
        free(ReaderRegister.DP_ReaderInfo);

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer response message in SstReadOpen(\"%s\")\n", Filename,
                   ReaderRegister.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, ReaderRegister.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before the SST Reader Open "
                            "could be completed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose, "finished wait writer response message in read_open\n");

        if (response)
        {
            WriterData.WriterCohortSize = response->WriterCohortSize;
            WriterData.WriterConfigParams = response->WriterConfigParams;
            WriterData.StartingStepNumber = response->NextStepNumber;
            WriterData.CP_WriterInfo = response->CP_WriterInfo;
            WriterData.DP_WriterInfo = response->DP_WriterInfo;
        }
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &WriterData, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }

    free(data_block);

    if (ReturnData->WriterCohortSize == -1)
    {
        /* Rank 0 found no writer at that contact point, fail the stream */
        free(free_block);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        CP_verbose(Stream, SummaryVerbose, "Opening Reader Stream.\nWriter stream params are:\n");
        CP_dumpParams(Stream, ReturnData->WriterConfigParams, 0 /* writer side */);
        CP_verbose(Stream, SummaryVerbose, "Reader stream params are:\n");
        CP_dumpParams(Stream, Stream->ConfigParams, 1 /* reader side */);
    }

    //    printf("I am reader rank %d, my info on writers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_writer_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    Stream->WriterCohortSize = ReturnData->WriterCohortSize;
    Stream->WriterConfigParams = ReturnData->WriterConfigParams;
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing FFS-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalBP) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing BP-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Minimum Connection Communication pattern (min)\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Peer-based Communication pattern (peer)\n");
    }
    STREAM_MUTEX_LOCK(Stream);
    Stream->ReaderTimestep = ReturnData->StartingStepNumber - 1;

    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        /*
         *  Wait for connections and messages from writer side peers
         */
        getPeerArrays(Stream->CohortSize, Stream->Rank, Stream->WriterCohortSize, &Stream->Peers,
                      NULL);

        while (!HasAllPeers(Stream))
        {
            /* wait until we get the timestep metadata or something else changes
             */
            STREAM_CONDITION_WAIT(Stream);
        }
    }
    else
    {
        if (!Stream->ConnectionsToWriter)
        {
            Stream->ConnectionsToWriter =
                calloc(sizeof(CP_PeerConnection), ReturnData->WriterCohortSize);
        }
    }

    for (int i = 0; i < ReturnData->WriterCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_WriterInfo[i]->ContactInfo);
        Stream->ConnectionsToWriter[i].ContactList = attrs;
        Stream->ConnectionsToWriter[i].RemoteStreamID = ReturnData->CP_WriterInfo[i]->WriterID;
    }

    // Deref the original connection to writer rank 0 (might still be open as a
    // peer)
    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        if (rank0_to_rank0_conn)
        {
            CMConnection_dereference(rank0_to_rank0_conn);
        }
    }
    else
    {
        /* only rely on the rank 0 to rank 0 that we already have (if we're rank
         * 0) */
        if (rank0_to_rank0_conn)
        {
            CMConnection conn = rank0_to_rank0_conn;
            Stream->ConnectionsToWriter[0].CMconn = conn;
            CMconn_register_close_handler(conn, ReaderConnCloseHandler, (void *)Stream);
        }
    }
    Stream->Status = Established;
    gettimeofday(&Stop, NULL);
    timersub(&Stop, &Start, &Diff);
    Stream->OpenTimeSecs = (double)Diff.tv_usec / 1e6 + Diff.tv_sec;
    gettimeofday(&Stream->ValidStartTime, NULL);
    Stream->Filename = Filename;
    Stream->ParamsBlock = free_block;
    STREAM_MUTEX_UNLOCK(Stream);
    AddToLastCallFreeList(Stream);
    Stream->DP_Interface->provideWriterDataToReader(
        &Svcs, Stream->DP_Stream, ReturnData->WriterCohortSize, Stream->ConnectionsToWriter,
        ReturnData->DP_WriterInfo);
    CP_verbose(Stream, PerRankVerbose, "Sending Reader Activate messages to writer\n");
    memset(&Msg, 0, sizeof(Msg));
    sendOneToEachWriterRank(Stream, Stream->CPInfo->SharedCM->ReaderActivateFormat, &Msg,
                            &Msg.WSR_Stream);
    CP_verbose(Stream, PerStepVerbose,
               "Finish opening Stream \"%s\", starting with Step number %ld\n", Filename,
               ReturnData->StartingStepNumber);

    return Stream;
}